

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QList<unsigned_int> * qt_convert_to_ucs4(QStringView string)

{
  QStringView string_00;
  bool bVar1;
  char32_t cVar2;
  QStringIterator *in_RDI;
  long in_FS_OFFSET;
  uint *a;
  QList<unsigned_int> *v;
  QStringIterator it;
  qsizetype in_stack_ffffffffffffff70;
  QStringIterator *this;
  storage_type_conflict *psVar3;
  char32_t *local_60;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->e = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->i = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->pos = (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QStringView::size(&local_18);
  QList<unsigned_int>::QList((QList<unsigned_int> *)this,(qsizetype)in_RDI);
  local_60 = (char32_t *)QList<unsigned_int>::constData((QList<unsigned_int> *)0x513350);
  string_00.m_data = psVar3;
  string_00.m_size = (qsizetype)this;
  QStringIterator::QStringIterator(in_RDI,string_00,in_stack_ffffffffffffff70);
  while (bVar1 = QStringIterator::hasNext((QStringIterator *)0x5133a1), bVar1) {
    cVar2 = QStringIterator::next(in_RDI,(char32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    *local_60 = cVar2;
    local_60 = local_60 + 1;
  }
  QList<unsigned_int>::constData((QList<unsigned_int> *)0x5133ff);
  QList<unsigned_int>::resize((QList<unsigned_int> *)this,(qsizetype)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<unsigned_int> *)in_RDI;
}

Assistant:

static QList<uint> qt_convert_to_ucs4(QStringView string)
{
    QList<uint> v(string.size());
    uint *a = const_cast<uint*>(v.constData());
    QStringIterator it(string);
    while (it.hasNext())
        *a++ = it.next();
    v.resize(a - v.constData());
    return v;
}